

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O3

PHYSFS_sint64 zip_find_end_of_central_dir(PHYSFS_Io *io,PHYSFS_sint64 *len)

{
  ulong _len;
  int iVar1;
  ulong uVar2;
  size_t _len_00;
  long lVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar7;
  PHYSFS_uint64 PVar8;
  undefined4 uVar9;
  PHYSFS_uint8 buf [256];
  int local_160;
  undefined8 local_140;
  undefined4 local_138;
  ulong uVar6;
  
  uVar2 = (*io->length)(io);
  if (uVar2 != 0xffffffffffffffff) {
    _len_00 = 0x100;
    if (uVar2 < 0x100) {
      _len_00 = uVar2;
    }
    if (0 < (long)uVar2) {
      PVar8 = 0;
      if (0xff < uVar2) {
        PVar8 = uVar2 - 0x100;
      }
      local_160 = (int)_len_00;
      _len = (long)local_160 - 4;
      local_140 = (ulong)(local_160 - 3);
      uVar7 = 0;
      uVar9 = 0;
      do {
        iVar1 = (*io->seek)(io,PVar8);
        if (iVar1 == 0) {
          return -1;
        }
        if ((int)uVar7 == 0) {
          iVar1 = __PHYSFS_readAll(io,&local_138,_len_00);
          uVar7 = _len_00;
          if (iVar1 == 0) {
            return -1;
          }
        }
        else {
          iVar1 = __PHYSFS_readAll(io,&local_138,_len);
          if (iVar1 == 0) {
            return -1;
          }
          *(undefined4 *)((long)&local_140 + (long)local_160 + 4) = uVar9;
          uVar7 = (ulong)(uint)((int)uVar7 + (int)_len);
        }
        if (4 < uVar2) {
          lVar3 = (_len & 0xffffffff) + PVar8;
          pcVar4 = (char *)((long)&local_138 + (_len & 0xffffffff) + 3);
          uVar6 = local_140;
          do {
            if ((((pcVar4[-3] == 'P') && (pcVar4[-2] == 'K')) && (pcVar4[-1] == '\x05')) &&
               (*pcVar4 == '\x06')) {
              if (len == (PHYSFS_sint64 *)0x0) {
                return lVar3;
              }
              *len = uVar2;
              return lVar3;
            }
            lVar3 = lVar3 + -1;
            uVar5 = (int)uVar6 - 1;
            uVar6 = (ulong)uVar5;
            pcVar4 = pcVar4 + -1;
          } while (1 < (int)uVar5);
        }
        PVar8 = PVar8 - _len;
        if ((long)PVar8 < 1) {
          PVar8 = 0;
        }
      } while (((int)uVar7 < 0x10015) && (uVar9 = local_138, (long)(int)uVar7 < (long)uVar2));
    }
    PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
  }
  return -1;
}

Assistant:

static PHYSFS_sint64 zip_find_end_of_central_dir(PHYSFS_Io *io, PHYSFS_sint64 *len)
{
    PHYSFS_uint8 buf[256];
    PHYSFS_uint8 extra[4] = { 0, 0, 0, 0 };
    PHYSFS_sint32 i = 0;
    PHYSFS_sint64 filelen;
    PHYSFS_sint64 filepos;
    PHYSFS_sint32 maxread;
    PHYSFS_sint32 totalread = 0;
    int found = 0;

    filelen = io->length(io);
    BAIL_IF_ERRPASS(filelen == -1, -1);

    /*
     * Jump to the end of the file and start reading backwards.
     *  The last thing in the file is the zipfile comment, which is variable
     *  length, and the field that specifies its size is before it in the
     *  file (argh!)...this means that we need to scan backwards until we
     *  hit the end-of-central-dir signature. We can then sanity check that
     *  the comment was as big as it should be to make sure we're in the
     *  right place. The comment length field is 16 bits, so we can stop
     *  searching for that signature after a little more than 64k at most,
     *  and call it a corrupted zipfile.
     */

    if (sizeof (buf) < filelen)
    {
        filepos = filelen - sizeof (buf);
        maxread = sizeof (buf);
    } /* if */
    else
    {
        filepos = 0;
        maxread = (PHYSFS_uint32) filelen;
    } /* else */

    while ((totalread < filelen) && (totalread < 65557))
    {
        BAIL_IF_ERRPASS(!io->seek(io, filepos), -1);

        /* make sure we catch a signature between buffers. */
        if (totalread != 0)
        {
            if (!__PHYSFS_readAll(io, buf, maxread - 4))
                return -1;
            memcpy(&buf[maxread - 4], &extra, sizeof (extra));
            totalread += maxread - 4;
        } /* if */
        else
        {
            if (!__PHYSFS_readAll(io, buf, maxread))
                return -1;
            totalread += maxread;
        } /* else */

        memcpy(&extra, buf, sizeof (extra));

        for (i = maxread - 4; i > 0; i--)
        {
            if ((buf[i + 0] == 0x50) &&
                (buf[i + 1] == 0x4B) &&
                (buf[i + 2] == 0x05) &&
                (buf[i + 3] == 0x06) )
            {
                found = 1;  /* that's the signature! */
                break;  
            } /* if */
        } /* for */

        if (found)
            break;

        filepos -= (maxread - 4);
        if (filepos < 0)
            filepos = 0;
    } /* while */

    BAIL_IF(!found, PHYSFS_ERR_UNSUPPORTED, -1);

    if (len != NULL)
        *len = filelen;

    return (filepos + i);
}